

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Maybe<kj::Own<capnp::SchemaFile>_> __thiscall
capnp::SchemaFile::DiskSchemaFile::import(DiskSchemaFile *this,StringPtr target)

{
  long lVar1;
  long lVar2;
  Path *params_1;
  StringPtr path;
  StringPtr pathText;
  Disposer *pDVar3;
  ReadableFile *pRVar4;
  String *pSVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong in_RCX;
  DiskSchemaFile *extraout_RDX;
  DiskSchemaFile *extraout_RDX_00;
  DiskSchemaFile *pDVar9;
  DiskSchemaFile *extraout_RDX_01;
  DiskSchemaFile *extraout_RDX_02;
  DiskSchemaFile *extraout_RDX_03;
  DiskSchemaFile *extraout_RDX_04;
  DiskSchemaFile *extraout_RDX_05;
  DiskSchemaFile *extraout_RDX_06;
  long lVar10;
  char *pcVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Own<capnp::SchemaFile::DiskSchemaFile> OVar14;
  Maybe<kj::Own<capnp::SchemaFile>_> MVar15;
  Path parsed;
  Path parsed_1;
  OwnOwn<const_kj::ReadableFile> newFile;
  size_t in_stack_fffffffffffffdd8;
  FsNode *local_220;
  String *local_210;
  Own<const_kj::ReadableFile> local_208;
  char *local_1f8;
  char **local_1f0;
  Path local_1e8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  Maybe<kj::String> local_1c0;
  char *local_1a0;
  size_t local_198;
  Maybe<kj::Exception> local_190;
  
  local_1a0 = (char *)target.content.size_;
  pcVar11 = target.content.ptr;
  if ((in_RCX < 2) || (*local_1a0 != '/')) {
    local_208 = *(Own<const_kj::ReadableFile> *)(pcVar11 + 0x10);
    local_198 = in_RCX;
    local_208 = (Own<const_kj::ReadableFile>)kj::PathPtr::parent((PathPtr *)&local_208);
    pathText.content.size_ = local_198;
    pathText.content.ptr = local_1a0;
    kj::PathPtr::eval(&local_1e8,(PathPtr *)&local_208,pathText);
    local_1c0.ptr._0_8_ = local_1c0.ptr._0_8_ & 0xffffffffffffff00;
    if (pcVar11[0x60] == '\x01') {
      local_208.ptr = (ReadableFile *)&local_1c0;
      local_208.disposer = (Disposer *)&PTR_run_0064ad38;
      local_1f0 = &local_1a0;
      local_1f8 = pcVar11;
      kj::_::runCatchingExceptions(&local_190,(Runnable *)&local_208);
      if (local_190.ptr.isSet == true) {
        kj::Exception::~Exception(&local_190.ptr.field_1.value);
      }
    }
    (**(code **)(**(long **)(pcVar11 + 8) + 0x50))
              (&local_1d0,*(long **)(pcVar11 + 8),local_1e8.parts.ptr,local_1e8.parts.size_);
    local_208.disposer = local_1d0;
    local_208.ptr = uStack_1c8;
    if (uStack_1c8 == (ReadableFile *)0x0) {
      local_1d0._0_4_ = 0;
      local_1d0._4_4_ = 0;
      uVar12 = 0;
      uVar13 = 0;
      pDVar9 = extraout_RDX_02;
    }
    else {
      OVar14 = kj::
               heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,kj::Maybe<kj::String>>
                         ((kj *)&local_1d0,*(ReadableDirectory **)(pcVar11 + 8),&local_1e8,
                          (ArrayPtr<const_kj::ReadableDirectory_*const> *)(pcVar11 + 0x28),
                          &local_208,&local_1c0);
      pDVar9 = OVar14.ptr;
      uVar12 = (undefined4)uStack_1c8;
      uVar13 = uStack_1c8._4_4_;
      uStack_1c8 = (ReadableFile *)0x0;
    }
    pRVar4 = local_208.ptr;
    *(undefined4 *)&(this->super_SchemaFile)._vptr_SchemaFile = (undefined4)local_1d0;
    *(undefined4 *)((long)&(this->super_SchemaFile)._vptr_SchemaFile + 4) = local_1d0._4_4_;
    *(undefined4 *)&this->baseDir = uVar12;
    *(undefined4 *)((long)&this->baseDir + 4) = uVar13;
    if (local_208.ptr != (ReadableFile *)0x0) {
      local_208.ptr = (ReadableFile *)0x0;
      (**(local_208.disposer)->_vptr_Disposer)
                (local_208.disposer,
                 (_func_int *)
                 ((long)&(pRVar4->super_FsNode)._vptr_FsNode +
                 (long)(pRVar4->super_FsNode)._vptr_FsNode[-2]));
      pDVar9 = extraout_RDX_03;
    }
    uVar8 = local_1c0.ptr.field_1.value.content.size_;
    uVar7 = local_1c0.ptr.field_1.value.content.ptr;
    if ((local_1c0.ptr.isSet == true) &&
       ((FsNode *)local_1c0.ptr.field_1.value.content.ptr != (FsNode *)0x0)) {
      local_1c0.ptr.field_1.value.content.ptr = (char *)0x0;
      local_1c0.ptr.field_1.value.content.size_ = 0;
      (**(local_1c0.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_1c0.ptr.field_1.value.content.disposer,uVar7,1,uVar8,uVar8,0);
      pDVar9 = extraout_RDX_04;
    }
    sVar6 = local_1e8.parts.size_;
    pSVar5 = local_1e8.parts.ptr;
    if (local_1e8.parts.ptr != (String *)0x0) {
      local_1e8.parts.ptr = (String *)0x0;
      local_1e8.parts.size_ = 0;
      (**(local_1e8.parts.disposer)->_vptr_ArrayDisposer)
                (local_1e8.parts.disposer,pSVar5,0x18,sVar6,sVar6,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      pDVar9 = extraout_RDX_05;
    }
  }
  else {
    path.content.size_ = in_stack_fffffffffffffdd8;
    path.content.ptr = (char *)0x428724;
    kj::Path::parse(path);
    lVar1 = *(long *)(pcVar11 + 0x30);
    pDVar9 = extraout_RDX;
    if (lVar1 != 0) {
      lVar2 = *(long *)(pcVar11 + 0x28);
      local_210 = (String *)(this->super_SchemaFile)._vptr_SchemaFile;
      local_220 = &this->baseDir->super_FsNode;
      lVar10 = 0;
      do {
        params_1 = *(Path **)(lVar2 + lVar10);
        (*(code *)(params_1->parts).ptr[3].content.size_)
                  (&local_1e8,params_1,local_208.disposer,local_208.ptr);
        sVar6 = local_1e8.parts.size_;
        local_1c0.ptr._0_8_ = local_1e8.parts.ptr;
        local_1c0.ptr.field_1.value.content.ptr = (char *)local_1e8.parts.size_;
        pDVar9 = extraout_RDX_00;
        if ((FsNode *)local_1e8.parts.size_ != (FsNode *)0x0) {
          local_1d0 = (Disposer *)0x0;
          OVar14 = kj::
                   heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>const&,kj::Own<kj::ReadableFile_const>,decltype(nullptr)>
                             ((ReadableDirectory *)&local_1e8,params_1,
                              (ArrayPtr<const_kj::ReadableDirectory_*const> *)&local_208,
                              (Own<const_kj::ReadableFile> *)(pcVar11 + 0x28),(void **)&local_1c0);
          pDVar9 = OVar14.ptr;
          local_210 = local_1e8.parts.ptr;
          local_220 = (FsNode *)local_1e8.parts.size_;
        }
        uVar7 = local_1c0.ptr.field_1.value.content.ptr;
        if ((FsNode *)local_1c0.ptr.field_1.value.content.ptr != (FsNode *)0x0) {
          local_1c0.ptr.field_1.value.content.ptr = (char *)0x0;
          (**(code **)*(_func_int **)local_1c0.ptr._0_8_)
                    (local_1c0.ptr._0_8_,(char *)(uVar7 + (long)(*(_func_int ***)uVar7)[-2]));
          pDVar9 = extraout_RDX_01;
        }
        if ((FsNode *)sVar6 != (FsNode *)0x0) {
          this->baseDir = (ReadableDirectory *)local_220;
          (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)local_210;
          goto LAB_004289c3;
        }
        lVar10 = lVar10 + 8;
      } while (lVar1 << 3 != lVar10);
      this->baseDir = (ReadableDirectory *)local_220;
    }
    (this->super_SchemaFile)._vptr_SchemaFile = (_func_int **)0x0;
    this->baseDir = (ReadableDirectory *)0x0;
LAB_004289c3:
    pDVar3 = local_208.disposer;
    if (local_208.disposer != (Disposer *)0x0) {
      pRVar4 = local_208.ptr;
      local_208 = (Own<const_kj::ReadableFile>)ZEXT816(0);
      (*(code *)**(undefined8 **)local_1f8)
                (local_1f8,pDVar3,0x18,pRVar4,pRVar4,
                 kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      pDVar9 = extraout_RDX_06;
    }
  }
  MVar15.ptr.ptr = &pDVar9->super_SchemaFile;
  MVar15.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::SchemaFile>_>)MVar15.ptr;
}

Assistant:

kj::Maybe<kj::Own<SchemaFile>> import(kj::StringPtr target) const override {
    if (target.startsWith("/")) {
      auto parsed = kj::Path::parse(target.slice(1));
      for (auto candidate: importPath) {
        KJ_IF_MAYBE(newFile, candidate->tryOpenFile(parsed)) {
          return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
              *candidate, kj::mv(parsed), importPath, kj::mv(*newFile), nullptr));
        }
      }
      return nullptr;
    } else {
      auto parsed = path.parent().eval(target);

      kj::Maybe<kj::String> displayNameOverride;
      if (displayNameOverridden) {
        // Try to create a consistent display name override for the imported file. This is for
        // backwards-compatibility only -- display names are only overridden when using the
        // deprecated parseDiskFile() interface.
        kj::runCatchingExceptions([&]() {
          displayNameOverride = kj::Path::parse(displayName).parent().eval(target).toString();
        });
      }

      KJ_IF_MAYBE(newFile, baseDir.tryOpenFile(parsed)) {
        return kj::implicitCast<kj::Own<SchemaFile>>(kj::heap<DiskSchemaFile>(
            baseDir, kj::mv(parsed), importPath, kj::mv(*newFile), kj::mv(displayNameOverride)));
      } else {
        return nullptr;
      }
    }
  }